

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

boolean not_fully_identified_core(obj *otmp,boolean ignore_bknown)

{
  byte bVar1;
  uint uVar2;
  boolean bVar3;
  char cVar4;
  ushort uVar5;
  
  if (otmp->oclass != '\f') {
    uVar2 = *(uint *)&otmp->field_0x4a;
    cVar4 = (char)uVar2;
    if ((~uVar2 & 0x30) != 0) {
      return '\x01';
    }
    if (ignore_bknown == '\0' && (uVar2 & 0x40) == 0) {
      return '\x01';
    }
    if ((objects[otmp->otyp].field_0x10 & 1) == 0) {
      return '\x01';
    }
    if ((otmp->oprops & ((ulong)~(uint)otmp->oprops_known | 0xfffffffffff00000)) != 0) {
      return '\x01';
    }
    if (otmp->oartifact != '\0') {
      bVar3 = undiscovered_artifact(otmp->oartifact);
      if (bVar3 != '\0') {
        return '\x01';
      }
      cVar4 = (char)*(undefined4 *)&otmp->field_0x4a;
    }
    if ((-1 < cVar4) &&
       (((bVar1 = otmp->oclass, bVar1 - 2 < 2 || (bVar1 == 0xf)) ||
        ((bVar1 == 6 && (objects[otmp->otyp].oc_subtyp != '\0')))))) {
      uVar5 = *(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f;
      if (uVar5 == 0xb) {
        return '\x01';
      }
      if (uVar5 == 0xd) {
        return '\x01';
      }
      bVar3 = is_flammable(otmp);
      return bVar3 != '\0';
    }
  }
  return '\0';
}

Assistant:

boolean not_fully_identified_core(const struct obj *otmp, boolean ignore_bknown)
{
    /* gold doesn't have any interesting attributes [yet?] */
    if (otmp->oclass == COIN_CLASS) return FALSE;	/* always fully ID'd */

    /* check fundamental ID hallmarks first */
    if (!otmp->known || !otmp->dknown || (!ignore_bknown && !otmp->bknown) ||
	    !objects[otmp->otyp].oc_name_known)	/* ?redundant? */
	return TRUE;
    if ((otmp->oprops_known & otmp->oprops & ITEM_PROP_MASK) != otmp->oprops)
	return TRUE;
    if (otmp->oartifact && undiscovered_artifact(otmp->oartifact))
	return TRUE;
    /* otmp->rknown is the only item of interest if we reach here */
       /*
	*  Note:  if a revision ever allows scrolls to become fireproof or
	*  rings to become shockproof, this checking will need to be revised.
	*  `rknown' ID only matters if xname() will provide the info about it.
	*/
    if (otmp->rknown || (otmp->oclass != ARMOR_CLASS &&
			 otmp->oclass != WEAPON_CLASS &&
			 !is_weptool(otmp) &&		    /* (redunant) */
			 otmp->oclass != BALL_CLASS))	    /* (useless) */
	return FALSE;
    else	/* lack of `rknown' only matters for vulnerable objects */
	return (boolean)(is_rustprone(otmp) ||
			 is_corrodeable(otmp) ||
			 is_flammable(otmp));
}